

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O1

void bonk_free(t_bonk *x)

{
  int *piVar1;
  t_filterbank *fatso;
  void *fatso_00;
  t_filterbank *ptVar2;
  t_filterbank *ptVar3;
  t_filterbank **pptVar4;
  int iVar5;
  long lVar6;
  t_float **pptVar7;
  long lVar8;
  
  iVar5 = x->x_ninsig;
  lVar6 = (long)iVar5;
  if (0 < lVar6) {
    pptVar7 = &x->x_insig->g_inbuf;
    do {
      freebytes(*pptVar7,(long)x->x_npoints << 2);
      pptVar7 = pptVar7 + 0x4b3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  freebytes(x->x_insig,lVar6 * 0x2598);
  clock_free(x->x_clock);
  fatso = x->x_filterbank;
  piVar1 = &fatso->b_refcount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    ptVar3 = bonk_filterbanklist;
    if (bonk_filterbanklist == fatso) {
      pptVar4 = &bonk_filterbanklist;
      ptVar3 = fatso;
    }
    else {
      do {
        ptVar2 = ptVar3;
        ptVar3 = ptVar2->b_next;
        if (ptVar3 == (t_filterbank *)0x0) goto LAB_001a422a;
      } while (ptVar3 != fatso);
      pptVar4 = &ptVar2->b_next;
    }
    *pptVar4 = ptVar3->b_next;
LAB_001a422a:
    iVar5 = fatso->b_nfilters;
    if (0 < iVar5) {
      lVar8 = 0;
      lVar6 = 0;
      do {
        fatso_00 = *(void **)((long)&fatso->b_vec->k_stuff + lVar8);
        if (fatso_00 != (void *)0x0) {
          freebytes(fatso_00,(long)*(int *)((long)&fatso->b_vec->k_filterpoints + lVar8) << 2);
        }
        lVar6 = lVar6 + 1;
        iVar5 = fatso->b_nfilters;
        lVar8 = lVar8 + 0x20;
      } while (lVar6 < iVar5);
    }
    freebytes(fatso->b_vec,(long)iVar5 << 5);
    freebytes(fatso,0x30);
  }
  freebytes(x->x_template,(long)x->x_ntemplate * 800);
  return;
}

Assistant:

static void bonk_free(t_bonk *x)
{
    
    int i, ninsig = x->x_ninsig;
    t_insig *gp = x->x_insig;
#ifdef MSP
    dsp_free((t_pxobject *)x);
#endif
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        freebytes(gp->g_inbuf, x->x_npoints * sizeof(t_float));
    freebytes(x->x_insig, ninsig * sizeof(*x->x_insig));
    clock_free(x->x_clock);
    if (!--(x->x_filterbank->b_refcount))
        bonk_freefilterbank(x->x_filterbank);
    freebytes(x->x_template, x->x_ntemplate * sizeof(x->x_template[0]));
}